

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::LookCharN
          (AsciiParser *this,size_t n,vector<char,_std::allocator<char>_> *nc)

{
  StreamReader *this_00;
  uint64_t pos;
  char *__nbytes;
  ssize_t sVar1;
  bool ok;
  uint64_t loc;
  undefined1 local_38 [8];
  vector<char,_std::allocator<char>_> buf;
  vector<char,_std::allocator<char>_> *nc_local;
  size_t n_local;
  AsciiParser *this_local;
  
  buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = nc;
  ::std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_38,n,(allocator_type *)((long)&loc + 7));
  ::std::allocator<char>::~allocator((allocator<char> *)((long)&loc + 7));
  pos = CurrLoc(this);
  this_00 = this->_sr;
  __nbytes = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)local_38);
  sVar1 = StreamReader::read(this_00,(int)n,(void *)n,(size_t)__nbytes);
  if (sVar1 != 0) {
    ::std::vector<char,_std::allocator<char>_>::operator=
              ((vector<char,_std::allocator<char>_> *)
               buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_,
               (vector<char,_std::allocator<char>_> *)local_38);
  }
  SeekTo(this,pos);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_38)
  ;
  return sVar1 != 0;
}

Assistant:

bool AsciiParser::LookCharN(size_t n, std::vector<char> *nc) {
  std::vector<char> buf(n);

  auto loc = CurrLoc();

  bool ok = _sr->read(n, n, reinterpret_cast<uint8_t *>(buf.data()));
  if (ok) {
    (*nc) = buf;
  }

  SeekTo(loc);

  return ok;
}